

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

void __thiscall BufferedReader::~BufferedReader(BufferedReader *this)

{
  bool bVar1;
  reference ppVar2;
  ReaderData *pData;
  pair<const_int,_ReaderData_*> *m_reader;
  iterator __end1;
  iterator __begin1;
  map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
  *__range1;
  BufferedReader *local_10;
  BufferedReader *this_local;
  
  (this->super_AbstractReader)._vptr_AbstractReader = (_func_int **)&PTR__BufferedReader_00440380;
  (this->super_TerminatableThread)._vptr_TerminatableThread =
       (_func_int **)&PTR__BufferedReader_00440410;
  local_10 = this;
  terminate(this);
  __range1._4_4_ = 0;
  SafeQueueWithNotification<int>::push
            (&(this->m_readQueue).super_SafeQueueWithNotification<int>,(int *)((long)&__range1 + 4))
  ;
  TerminatableThread::join(&this->super_TerminatableThread);
  __end1 = std::
           map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
           ::begin(&this->m_readers);
  m_reader = (pair<const_int,_ReaderData_*> *)
             std::
             map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
             ::end(&this->m_readers);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&m_reader);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>::operator*(&__end1);
    if (ppVar2->second != (ReaderData *)0x0) {
      (*ppVar2->second->_vptr_ReaderData[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>::operator++(&__end1);
  }
  std::map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
  ::~map(&this->m_readers);
  std::condition_variable::~condition_variable(&this->m_readCond);
  WaitableSafeQueue<int>::~WaitableSafeQueue(&this->m_readQueue);
  TerminatableThread::~TerminatableThread(&this->super_TerminatableThread);
  AbstractReader::~AbstractReader(&this->super_AbstractReader);
  return;
}

Assistant:

BufferedReader::~BufferedReader()
{
    terminate();
    m_readQueue.push(0);
    join();
    for (const auto& m_reader : m_readers)
    {
        const ReaderData* pData = m_reader.second;
        delete pData;
    }
}